

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void lest::report(ostream *os,message *e,text *test)

{
  ostream *poVar1;
  char *pcVar2;
  allocator local_119;
  string local_118 [32];
  text local_f8;
  text local_d8;
  comment local_b8;
  text local_98;
  text local_78;
  location local_48;
  text *local_20;
  text *test_local;
  message *e_local;
  ostream *os_local;
  
  local_20 = test;
  test_local = (text *)e;
  e_local = (message *)os;
  location::location(&local_48,&e->where);
  poVar1 = operator<<(os,&local_48);
  poVar1 = std::operator<<(poVar1,": ");
  std::__cxx11::string::string((string *)&local_98,(string *)(test_local->field_2)._M_local_buf);
  colourise(&local_78,&local_98);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  comment::comment(&local_b8,(comment *)((long)&test_local[2].field_2 + 8));
  poVar1 = operator<<(poVar1,&local_b8);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)test);
  poVar1 = std::operator<<(poVar1,": ");
  pcVar2 = (char *)(**(code **)(*(long *)test_local + 0x10))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,pcVar2,&local_119);
  std::__cxx11::string::string((string *)&local_f8,local_118);
  colourise(&local_d8,&local_f8);
  poVar1 = std::operator<<(poVar1,(string *)&local_d8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  comment::~comment(&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  location::~location(&local_48);
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, text test )
{
    os << e.where << ": " << colourise( e.kind ) << e.note << ": " << test << ": " << colourise( e.what() ) << std::endl;
}